

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void ParseOptions(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int local_64;
  undefined1 local_60 [3];
  bool seen_input_file;
  int i;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._4_4_ = argc;
  memset(local_60,0,0x48);
  Options::Options((Options *)local_60);
  Options::operator=(&g_options,(Options *)local_60);
  Options::~Options((Options *)local_60);
  local_64 = 1;
  bVar1 = false;
LAB_00153edc:
  do {
    if (argv_local._4_4_ <= local_64) {
      return;
    }
    iVar2 = strcmp("-h",local_18[local_64]);
    if (iVar2 == 0) {
LAB_00153f22:
      poVar3 = std::operator<<((ostream *)&std::cout,usage);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    iVar2 = strcmp("--help",local_18[local_64]);
    if (iVar2 == 0) goto LAB_00153f22;
    iVar2 = strcmp("-s",local_18[local_64]);
    if (iVar2 == 0) {
LAB_00153f85:
      if (argv_local._4_4_ <= local_64 + 1) {
        ParseError("expected argument for standard library path");
      }
      std::__cxx11::string::operator=((string *)&g_options,local_18[local_64 + 1]);
      local_64 = local_64 + 2;
      goto LAB_00153edc;
    }
    iVar2 = strcmp("--stdlib-path",local_18[local_64]);
    if (iVar2 == 0) goto LAB_00153f85;
    iVar2 = strcmp("-w",local_18[local_64]);
    if (iVar2 == 0) {
LAB_00154003:
      g_options.emit_warnings = true;
      local_64 = local_64 + 1;
    }
    else {
      iVar2 = strcmp("--warnings",local_18[local_64]);
      if (iVar2 == 0) goto LAB_00154003;
      iVar2 = strcmp("--gc-stress",local_18[local_64]);
      if (iVar2 == 0) {
        g_options.gc_stress = true;
        local_64 = local_64 + 1;
      }
      else {
        iVar2 = strcmp("--heap-verify",local_18[local_64]);
        if (iVar2 == 0) {
          g_options.heap_verify = true;
          local_64 = local_64 + 1;
        }
        else {
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"unexpected positional argument: ");
            poVar3 = std::operator<<(poVar3,local_18[local_64]);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            exit(1);
          }
          bVar1 = true;
          std::__cxx11::string::operator=((string *)&g_options.input_file,local_18[local_64]);
          local_64 = local_64 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

void ParseOptions(int argc, char **argv) {
  g_options = Options();
  int i = 1;
  bool seen_input_file = false;
  while (i < argc) {
    if (strcmp("-h", argv[i]) == 0 || strcmp("--help", argv[i]) == 0) {
      std::cout << usage << std::endl;
      std::exit(0);
    }

    if (strcmp("-s", argv[i]) == 0 || strcmp("--stdlib-path", argv[i]) == 0) {
      i++;
      if (i >= argc) {
        ParseError("expected argument for standard library path");
      }

      g_options.stdlib_path = argv[i++];
      continue;
    }

    if (strcmp("-w", argv[i]) == 0 || strcmp("--warnings", argv[i]) == 0) {
      i++;
      g_options.emit_warnings = true;
      continue;
    }

    if (strcmp("--gc-stress", argv[i]) == 0) {
      i++;
      g_options.gc_stress = true;
      continue;
    }

    if (strcmp("--heap-verify", argv[i]) == 0) {
      i++;
      g_options.heap_verify = true;
      continue;
    }

    if (!seen_input_file) {
      seen_input_file = true;
      g_options.input_file = argv[i++];
    } else {
      std::cout << "unexpected positional argument: " << argv[i] << std::endl;
      std::exit(1);
    }
  }
}